

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

void __thiscall
SimpleBVH::BVH::leaf_callback(BVH *this,VectorMax3d *p,int f,VectorMax3d *np,double *sq_d)

{
  MatrixXi *this_00;
  CoeffReturnType piVar1;
  long lVar2;
  MatrixXd *xpr;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_140 [56];
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_108;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_d0;
  undefined1 local_98 [64];
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> local_58 [32];
  double *local_38;
  
  if ((this->leafCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    this_00 = &this->faces;
    lVar2 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols;
    if (lVar2 == 3) {
      xpr = &this->vertices;
      lVar2 = (long)f;
      local_38 = sq_d;
      piVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)this_00,lVar2
                          ,0);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                (&local_d0,xpr,(long)*piVar1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_d0);
      piVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)this_00,lVar2
                          ,1);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                (&local_108,xpr,(long)*piVar1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)(local_98 + 0x20),
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_108);
      piVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)this_00,lVar2
                          ,2);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_140,
                 xpr,(long)*piVar1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                (local_58,local_140);
      point_triangle_squared_distance
                (p,(array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *)local_98,np,local_38);
    }
    else {
      if (lVar2 != 2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x22c,
                      "void SimpleBVH::BVH::leaf_callback(const VectorMax3d &, int, VectorMax3d &, double &) const"
                     );
      }
      local_38 = (double *)(long)f;
      piVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)this_00,
                          (Index)local_38,0);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                (&local_d0,&this->vertices,(long)*piVar1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_d0);
      piVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)this_00,
                          (Index)local_38,1);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                (&local_108,&this->vertices,(long)*piVar1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)(local_98 + 0x20),
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_108);
      point_segment_squared_distance
                (p,(array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)local_98,np,sq_d);
    }
  }
  else {
    std::
    function<void_(const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_&,_int,_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_&,_double_&)>
    ::operator()(&this->leafCallback,p,f,np,sq_d);
  }
  return;
}

Assistant:

void BVH::leaf_callback(
    const VectorMax3d& p, int f, VectorMax3d& np, double& sq_d) const
{
    if (leafCallback) {
        leafCallback(p, f, np, sq_d);
        return;
    }

    if (faces.cols() == 2) {
        point_segment_squared_distance(
            p, { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)) } }, np,
            sq_d);
        return;
    } else if (faces.cols() == 3) {
        point_triangle_squared_distance(
            p,
            { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)),
                vertices.row(faces(f, 2)) } },
            np, sq_d);
        return;
    }

    assert(false);
}